

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::clear_ValueOnUnknown(CategoricalMapping *this)

{
  ValueOnUnknownCase VVar1;
  string *default_value;
  CategoricalMapping *this_local;
  
  VVar1 = ValueOnUnknown_case(this);
  if ((VVar1 != VALUEONUNKNOWN_NOT_SET) && (VVar1 == kStrValue)) {
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->ValueOnUnknown_).strvalue_,default_value);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_ValueOnUnknown() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (ValueOnUnknown_case()) {
    case kStrValue: {
      ValueOnUnknown_.strvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kInt64Value: {
      // No need to clear
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = VALUEONUNKNOWN_NOT_SET;
}